

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_half.h.c
# Opt level: O2

int test_half_from_float(cl_float f,cl_half ref,cl_half_rounding_mode mode,char *mode_str)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  short sVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  uVar7 = (uint)f >> 0x1f;
  uVar5 = (uint)f >> 0x17 & 0xff;
  uVar1 = (uint)f & 0x7fffff;
  if (uVar5 == 0xff) {
    if (uVar1 == 0) {
      uVar6 = (ushort)(uVar7 << 0xf) | 0x7c00;
    }
    else {
      uVar6 = (ushort)(uVar7 << 0xf) | (ushort)(uVar1 >> 0xd) | 0x7e00;
    }
    goto LAB_00101282;
  }
  if (uVar5 == 0 && uVar1 == 0) {
    uVar6 = (ushort)(uVar7 << 0xf);
    goto LAB_00101282;
  }
  if (0x8e < uVar5) {
    if (mode == CL_HALF_RTZ) {
      uVar6 = (ushort)(uVar7 << 0xf) | 0x7bff;
    }
    else {
      uVar6 = 0xfbff;
      if ((-1 < (int)f || mode != CL_HALF_RTP) &&
         (uVar6 = 0x7bff, (int)f < 0 || mode != CL_HALF_RTN)) {
        uVar6 = (ushort)(uVar7 << 0xf) | 0x7c00;
      }
    }
    goto LAB_00101282;
  }
  if (uVar5 < 0x66) {
    uVar6 = (ushort)(uVar7 << 0xf);
    uVar4 = 0x8001;
    if (mode != CL_HALF_RTN) {
      uVar4 = uVar6;
    }
    if (-1 < (int)f) {
      uVar4 = uVar6;
    }
    uVar6 = 1;
    if (mode != CL_HALF_RTP) {
      uVar6 = uVar4;
    }
    if ((int)f < 0) {
      uVar6 = uVar4;
    }
    goto LAB_00101282;
  }
  sVar8 = (short)uVar5 + -0x70;
  bVar11 = 0x70 < uVar5;
  if (!bVar11) {
    sVar8 = 0;
  }
  uVar5 = uVar1 + 0x800000;
  if (bVar11) {
    uVar5 = uVar1;
  }
  bVar3 = 0xd;
  if (!bVar11) {
    bVar3 = 0x7e - (char)((uint)f >> 0x17);
  }
  uVar1 = uVar5 >> (bVar3 & 0x1f);
  uVar9 = 1 << (bVar3 - 1 & 0x1f);
  uVar10 = ~(-1 << (bVar3 & 0x1f));
  if (mode == CL_HALF_RTN) {
    bVar11 = (uVar5 & uVar10) != 0;
    uVar2 = (uint)((int)f < 0);
LAB_001013a4:
    uVar1 = uVar1 + ((byte)uVar2 & bVar11);
  }
  else {
    if (mode == CL_HALF_RTP) {
      bVar11 = (uVar5 & uVar10) != 0;
      uVar2 = (uint)(-1 < (int)f);
      goto LAB_001013a4;
    }
    if (mode == CL_HALF_RTE) {
      bVar11 = (uVar5 & uVar10) == uVar9;
      uVar2 = uVar1;
      if ((uVar5 & uVar10) <= uVar9) goto LAB_001013a4;
      uVar1 = uVar1 + 1;
    }
  }
  uVar6 = 0;
  if ((uVar1 & 0x400) == 0) {
    uVar6 = (ushort)uVar1;
  }
  uVar6 = (sVar8 + (short)((uVar1 & 0x400) >> 10)) * 0x400 | (ushort)(uVar7 << 0xf) | uVar6;
LAB_00101282:
  if (uVar6 != ref) {
    printf("\nERROR: converting 0x%08x to half (%s): expected 0x%04x, got 0x%04x\n",(ulong)(uint)f,
           mode_str,(ulong)ref,(ulong)uVar6);
  }
  return (uint)(uVar6 == ref);
}

Assistant:

int test_half_from_float(cl_float f, cl_half ref,
                         cl_half_rounding_mode mode, const char *mode_str)
{
  cl_half h = cl_half_from_float(f, mode);
  if (h != ref) {
    union FI f_i;
    f_i.f = f;
    printf(
      "\nERROR: converting 0x%08x to half (%s): expected 0x%04x, got 0x%04x\n",
      f_i.i, mode_str, ref, h);
    return 0;
  }
  return 1;
}